

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateConstructor
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private $classname$() {\n",(char (*) [10])0x3f42d2,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  io::Printer::Indent(printer);
  GenerateInitializers(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateConstructor(io::Printer* printer) {
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  GenerateInitializers(printer);

  printer->Outdent();
  printer->Print("}\n");
}